

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::Static_Conversion_Impl<henson::BaseCoroutine,_henson::PythonPuppet>::
convert_down(Static_Conversion_Impl<henson::BaseCoroutine,_henson::PythonPuppet> *this,
            Boxed_Value *t_base)

{
  Type_Info *t_from;
  bad_boxed_dynamic_cast *this_00;
  undefined8 *in_RDX;
  string local_38;
  
  this_00 = (bad_boxed_dynamic_cast *)__cxa_allocate_exception(0x48);
  t_from = (Type_Info *)*in_RDX;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "Unable to cast down inheritance hierarchy with non-polymorphic types","");
  chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
            (this_00,t_from,(type_info *)&henson::PythonPuppet::typeinfo,&local_38);
  __cxa_throw(this_00,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
              chaiscript::exception::bad_boxed_cast::~bad_boxed_cast);
}

Assistant:

virtual Boxed_Value convert_down(const Boxed_Value &t_base) const CHAISCRIPT_OVERRIDE
        {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_base.get_type_info(), typeid(Derived), "Unable to cast down inheritance hierarchy with non-polymorphic types");
        }